

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

void FT_Outline_Reverse(FT_Outline *outline)

{
  char cVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  FT_Pos FVar4;
  ushort uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  FT_Vector *pFVar9;
  char *pcVar10;
  FT_Vector *pFVar11;
  FT_Vector swap;
  
  if (outline != (FT_Outline *)0x0) {
    lVar8 = 0;
    for (uVar5 = 0; (short)uVar5 < outline->n_contours; uVar5 = uVar5 + 1) {
      lVar7 = (long)outline->contours[uVar5];
      pFVar11 = outline->points + lVar7;
      for (pFVar9 = outline->points + lVar8; pFVar9 < pFVar11; pFVar9 = pFVar9 + 1) {
        FVar2 = pFVar9->x;
        FVar3 = pFVar9->y;
        FVar4 = pFVar11->y;
        pFVar9->x = pFVar11->x;
        pFVar9->y = FVar4;
        pFVar11->x = FVar2;
        pFVar11->y = FVar3;
        pFVar11 = pFVar11 + -1;
      }
      pcVar10 = outline->tags + lVar7;
      for (pcVar6 = outline->tags + lVar8; pcVar6 < pcVar10; pcVar6 = pcVar6 + 1) {
        cVar1 = *pcVar6;
        *pcVar6 = *pcVar10;
        *pcVar10 = cVar1;
        pcVar10 = pcVar10 + -1;
      }
      lVar8 = lVar7 + 1;
    }
    *(byte *)&outline->flags = (byte)outline->flags ^ 4;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Reverse( FT_Outline*  outline )
  {
    FT_UShort  n;
    FT_Int     first, last;


    if ( !outline )
      return;

    first = 0;

    for ( n = 0; n < outline->n_contours; n++ )
    {
      last  = outline->contours[n];

      /* reverse point table */
      {
        FT_Vector*  p = outline->points + first;
        FT_Vector*  q = outline->points + last;
        FT_Vector   swap;


        while ( p < q )
        {
          swap = *p;
          *p   = *q;
          *q   = swap;
          p++;
          q--;
        }
      }

      /* reverse tags table */
      {
        char*  p = outline->tags + first;
        char*  q = outline->tags + last;


        while ( p < q )
        {
          char  swap;


          swap = *p;
          *p   = *q;
          *q   = swap;
          p++;
          q--;
        }
      }

      first = last + 1;
    }

    outline->flags ^= FT_OUTLINE_REVERSE_FILL;
  }